

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushStyleColor(ImGuiCol idx,ImVec4 *col)

{
  int *piVar1;
  ImVec4 *pIVar2;
  ImGuiColorMod *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImGuiContext *pIVar8;
  int iVar9;
  ImGuiColorMod *__dest;
  int iVar10;
  ImVec4 *pIVar11;
  int iVar12;
  ImGuiContext *ctx;
  
  pIVar8 = GImGui;
  pIVar11 = (GImGui->Style).Colors + idx;
  fVar4 = pIVar11->x;
  fVar5 = pIVar11->y;
  pIVar2 = (GImGui->Style).Colors + idx;
  fVar6 = pIVar2->z;
  fVar7 = pIVar2->w;
  iVar9 = (GImGui->ColorStack).Size;
  if (iVar9 == (GImGui->ColorStack).Capacity) {
    if (iVar9 == 0) {
      iVar10 = 8;
    }
    else {
      iVar10 = iVar9 / 2 + iVar9;
    }
    iVar12 = iVar9 + 1;
    if (iVar9 + 1 < iVar10) {
      iVar12 = iVar10;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (ImGuiColorMod *)(*GImAllocatorAllocFunc)((long)iVar12 * 0x14,GImAllocatorUserData);
    pIVar3 = (pIVar8->ColorStack).Data;
    if (pIVar3 != (ImGuiColorMod *)0x0) {
      memcpy(__dest,pIVar3,(long)(pIVar8->ColorStack).Size * 0x14);
      pIVar3 = (pIVar8->ColorStack).Data;
      if ((pIVar3 != (ImGuiColorMod *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    }
    (pIVar8->ColorStack).Data = __dest;
    (pIVar8->ColorStack).Capacity = iVar12;
    iVar9 = (pIVar8->ColorStack).Size;
  }
  else {
    __dest = (GImGui->ColorStack).Data;
  }
  __dest[iVar9].Col = idx;
  pIVar2 = &__dest[iVar9].BackupValue;
  pIVar2->x = fVar4;
  pIVar2->y = fVar5;
  pIVar2->z = fVar6;
  pIVar2->w = fVar7;
  (pIVar8->ColorStack).Size = (pIVar8->ColorStack).Size + 1;
  fVar4 = col->y;
  fVar5 = col->z;
  fVar6 = col->w;
  pIVar11->x = col->x;
  pIVar11->y = fVar4;
  pIVar2 = (pIVar8->Style).Colors + idx;
  pIVar2->z = fVar5;
  pIVar2->w = fVar6;
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, const ImVec4& col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorStack.push_back(backup);
    g.Style.Colors[idx] = col;
}